

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Gia_Man_t * Mf_ManDeriveMapping(Mf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Jf_Par_t *pJVar3;
  void *pvVar4;
  Vec_Int_t *p_00;
  int *__ptr;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_t __size;
  long lVar9;
  ulong uVar10;
  Gia_Man_t *pGVar11;
  
  pJVar3 = p->pPars;
  if ((pJVar3->fCutMin != 0) || (pGVar11 = p->pGia, pGVar11->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x495,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
  }
  uVar1 = pGVar11->nObjs;
  iVar6 = (int)pJVar3->Edge + uVar1;
  iVar2 = (int)pJVar3->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < (iVar6 + iVar2 * 2) - 1U) {
    iVar7 = iVar6 + iVar2 * 2;
  }
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    p_00->pArray = (int *)0x0;
    if (0 < (int)uVar1) {
      __size = (ulong)uVar1 * 4;
LAB_006e7c11:
      __ptr = (int *)malloc(__size);
      goto LAB_006e7c19;
    }
  }
  else {
    __ptr = (int *)malloc((long)iVar7 << 2);
    p_00->pArray = __ptr;
    if (iVar7 < (int)uVar1) {
      __size = (long)(int)uVar1 << 2;
      if (__ptr == (int *)0x0) goto LAB_006e7c11;
      __ptr = (int *)realloc(__ptr,__size);
LAB_006e7c19:
      p_00->pArray = __ptr;
      if (__ptr == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p_00->nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset(__ptr,0,(ulong)uVar1 * 4);
      iVar2 = pGVar11->nObjs;
      p_00->nSize = uVar1;
      if (0 < iVar2) {
        lVar9 = 0;
        do {
          if ((~*(uint *)(pGVar11->pObjs + lVar9) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar11->pObjs + lVar9)) {
            if (0xffff < *(uint *)&p->pLfObjs[lVar9].field_0xc) {
              uVar1 = p->pLfObjs[lVar9].iCutSet;
              uVar5 = (int)uVar1 >> 0x10;
              if (((int)uVar5 < 0) || ((p->vPages).nSize <= (int)uVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              if (p_00->nSize <= lVar9) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              pvVar4 = (p->vPages).pArray[uVar5];
              uVar10 = (ulong)(uVar1 & 0xffff);
              p_00->pArray[lVar9] = p_00->nSize;
              Vec_IntPush(p_00,*(uint *)((long)pvVar4 + uVar10 * 4 + 4) & 0x1f);
              if ((*(byte *)((long)pvVar4 + uVar10 * 4 + 4) & 0x1f) != 0) {
                uVar8 = 0;
                do {
                  Vec_IntPush(p_00,*(int *)((long)pvVar4 + uVar8 * 4 + uVar10 * 4 + 8));
                  uVar8 = uVar8 + 1;
                } while (uVar8 < (*(uint *)((long)pvVar4 + uVar10 * 4 + 4) & 0x1f));
              }
              Vec_IntPush(p_00,(int)lVar9);
              pGVar11 = p->pGia;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pGVar11->nObjs);
      }
      goto LAB_006e7d36;
    }
  }
  p_00->nSize = uVar1;
LAB_006e7d36:
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x4a3,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
  }
  pGVar11->vMapping = p_00;
  return pGVar11;
}

Assistant:

Gia_Man_t * Mf_ManDeriveMapping( Mf_Man_t * p )
{
    Vec_Int_t * vMapping;
    int i, k, * pCut;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Mf_CutSize(pCut) );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, pCut[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}